

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

char * SDL_AudioDriverName(char *namebuf,int maxlen)

{
  char *pcVar1;
  
  pcVar1 = (*SDL20_GetCurrentAudioDriver)();
  pcVar1 = GetDriverName(pcVar1,namebuf,maxlen);
  return pcVar1;
}

Assistant:

DECLSPEC12 const char * SDLCALL
SDL_AudioDriverName(char *namebuf, int maxlen)
{
    return GetDriverName(SDL20_GetCurrentAudioDriver(), namebuf, maxlen);
}